

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O1

void __thiscall flatbuffers::cpp::CppGenerator::GenEnumEquals(CppGenerator *this,EnumDef *enum_def)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  mapped_type *pmVar2;
  CodeWriter *this_00;
  undefined8 uVar3;
  _Alloc_hider _Var4;
  pointer ppEVar5;
  string native_type;
  key_type local_330;
  string local_310;
  CodeWriter *local_2f0;
  EnumDef *local_2e8;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  IDLOptions *local_260;
  pointer local_258;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if ((this->opts_).super_IDLOptions.gen_compare == true) {
    local_2e8 = enum_def;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
    this_00 = &this->code_;
    CodeWriter::operator+=(this_00,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,
               "inline bool operator==(const {{NAME}}Union &lhs, const {{NAME}}Union &rhs) {","");
    CodeWriter::operator+=(this_00,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"  if (lhs.type != rhs.type) return false;","");
    CodeWriter::operator+=(this_00,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"  switch (lhs.type) {","");
    CodeWriter::operator+=(this_00,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    ppEVar5 = (local_2e8->vals).vec.
              super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    local_258 = (local_2e8->vals).vec.
                super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    if (ppEVar5 != local_258) {
      local_260 = &(this->opts_).super_IDLOptions;
      paVar1 = &local_310.field_2;
      local_2f0 = this_00;
      do {
        local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"NATIVE_ID","");
        GetEnumValUse_abi_cxx11_(&local_310,this,local_2e8,*ppEVar5);
        pmVar2 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this_00->value_map_,&local_330);
        std::__cxx11::string::_M_assign((string *)pmVar2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p != paVar1) {
          operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330._M_dataplus._M_p != &local_330.field_2) {
          operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
        }
        if ((*ppEVar5)->value == 0) {
          local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_210,"    case {{NATIVE_ID}}: {","");
          CodeWriter::operator+=(this_00,&local_210);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != &local_210.field_2) {
            operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
          }
          local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_230,"      return true;","");
          CodeWriter::operator+=(local_2f0,&local_230);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != &local_230.field_2) {
            operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
          }
          local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"    }","");
          this_00 = local_2f0;
          CodeWriter::operator+=(local_2f0,&local_250);
          uVar3 = local_250.field_2._M_allocated_capacity;
          _Var4._M_p = local_250._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) goto LAB_0018322e;
        }
        else {
          GetUnionElement_abi_cxx11_(&local_330,this,*ppEVar5,true,local_260);
          local_310._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"NATIVE_TYPE","");
          pmVar2 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&this_00->value_map_,&local_310);
          std::__cxx11::string::_M_assign((string *)pmVar2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p != paVar1) {
            operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
          }
          local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_280,"    case {{NATIVE_ID}}: {","");
          CodeWriter::operator+=(this_00,&local_280);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_280._M_dataplus._M_p != &local_280.field_2) {
            operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
          }
          local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2a0,
                     "      return *(reinterpret_cast<const {{NATIVE_TYPE}} *>(lhs.value)) ==","");
          CodeWriter::operator+=(this_00,&local_2a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
            operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
          }
          local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2c0,
                     "             *(reinterpret_cast<const {{NATIVE_TYPE}} *>(rhs.value));","");
          CodeWriter::operator+=(this_00,&local_2c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
            operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
          }
          local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"    }","");
          CodeWriter::operator+=(this_00,&local_2e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
            operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
          }
          uVar3 = local_330.field_2._M_allocated_capacity;
          _Var4._M_p = local_330._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_330._M_dataplus._M_p != &local_330.field_2) {
LAB_0018322e:
            operator_delete(_Var4._M_p,uVar3 + 1);
          }
        }
        ppEVar5 = ppEVar5 + 1;
      } while (ppEVar5 != local_258);
    }
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"    default: {","");
    CodeWriter::operator+=(this_00,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"      return false;","");
    CodeWriter::operator+=(this_00,&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"    }","");
    CodeWriter::operator+=(this_00,&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"  }","");
    CodeWriter::operator+=(this_00,&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"}","");
    CodeWriter::operator+=(this_00,&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"");
    CodeWriter::operator+=(this_00,&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_190,
               "inline bool operator!=(const {{NAME}}Union &lhs, const {{NAME}}Union &rhs) {","");
    CodeWriter::operator+=(this_00,&local_190);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b0,"    return !(lhs == rhs);","");
    CodeWriter::operator+=(this_00,&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"}","");
    CodeWriter::operator+=(this_00,&local_1d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"");
    CodeWriter::operator+=(this_00,&local_1f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void GenEnumEquals(const EnumDef &enum_def) {
    if (opts_.gen_compare) {
      code_ += "";
      code_ +=
          "inline bool operator==(const {{NAME}}Union &lhs, const "
          "{{NAME}}Union &rhs) {";
      code_ += "  if (lhs.type != rhs.type) return false;";
      code_ += "  switch (lhs.type) {";

      for (const auto &ev : enum_def.Vals()) {
        code_.SetValue("NATIVE_ID", GetEnumValUse(enum_def, *ev));
        if (ev->IsNonZero()) {
          const auto native_type = GetUnionElement(*ev, true, opts_);
          code_.SetValue("NATIVE_TYPE", native_type);
          code_ += "    case {{NATIVE_ID}}: {";
          code_ +=
              "      return *(reinterpret_cast<const {{NATIVE_TYPE}} "
              "*>(lhs.value)) ==";
          code_ +=
              "             *(reinterpret_cast<const {{NATIVE_TYPE}} "
              "*>(rhs.value));";
          code_ += "    }";
        } else {
          code_ += "    case {{NATIVE_ID}}: {";
          code_ += "      return true;";  // "NONE" enum value.
          code_ += "    }";
        }
      }
      code_ += "    default: {";
      code_ += "      return false;";
      code_ += "    }";
      code_ += "  }";
      code_ += "}";

      code_ += "";
      code_ +=
          "inline bool operator!=(const {{NAME}}Union &lhs, const "
          "{{NAME}}Union &rhs) {";
      code_ += "    return !(lhs == rhs);";
      code_ += "}";
      code_ += "";
    }
  }